

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
* __thiscall
spirv_cross::Compiler::get_active_interface_variables
          (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
           *__return_storage_ptr__,Compiler *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRFunction *func;
  SPIRVariable *pSVar6;
  __node_base_ptr p_Var7;
  ulong __code;
  __hashtable *__h;
  long lVar8;
  __node_gen_type __node_gen;
  InterfaceVariableAccessHandler handler;
  LoopLock local_70;
  uint32_t local_64;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  *local_60;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_58;
  FunctionID *local_50;
  OpcodeHandler local_48;
  Compiler *local_40;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  *local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_48._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_003aa1b8;
  local_40 = this;
  local_38 = __return_storage_ptr__;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_48);
  ParsedIR::create_loop_hard_lock(&this->ir);
  sVar2 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar2 != 0) {
    local_50 = &(this->ir).default_entry_point;
    pTVar3 = (this->ir).ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_58 = &(this->ir).entry_points._M_h;
    lVar8 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        if (pSVar6->storage == StorageClassOutput) {
          bVar5 = interface_variable_exists_in_entry_point(this,(pSVar6->super_IVariant).self.id);
          if (bVar5) {
            if ((pSVar6->initializer).id == 0) {
              __code = (ulong)(this->ir).default_entry_point.id;
              p_Var7 = ::std::
                       _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::_M_find_before_node
                                 (local_58,__code % (this->ir).entry_points._M_h._M_bucket_count,
                                  local_50,__code);
              if (*(int *)&p_Var7->_M_nxt[0x1f]._M_nxt == 4) goto LAB_002c5038;
            }
            local_64 = (pSVar6->super_IVariant).self.id;
            local_60 = __return_storage_ptr__;
            ::std::
            _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                      ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)__return_storage_ptr__,&local_64,&local_60);
          }
        }
      }
LAB_002c5038:
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  local_70.lock._0_4_ = this->dummy_sampler_id;
  if ((uint32_t)local_70.lock != 0) {
    local_60 = __return_storage_ptr__;
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
              ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_set<VariableID> Compiler::get_active_interface_variables() const
{
	// Traverse the call graph and find all interface variables which are in use.
	unordered_set<VariableID> variables;
	InterfaceVariableAccessHandler handler(*this, variables);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// An output variable which is just declared (but uninitialized) might be read by subsequent stages
		// so we should force-enable these outputs,
		// since compilation will fail if a subsequent stage attempts to read from the variable in question.
		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0) || get_execution_model() != ExecutionModelFragment)
			variables.insert(var.self);
	});

	// If we needed to create one, we'll need it.
	if (dummy_sampler_id)
		variables.insert(dummy_sampler_id);

	return variables;
}